

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O3

bool __thiscall
iDynTree::InverseKinematics::deactivateFrameConstraint(InverseKinematics *this,string *frameName)

{
  iDynTree::reportError
            ("InverseKinematics","",
             "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics");
  return false;
}

Assistant:

bool InverseKinematics::deactivateFrameConstraint(const std::string& frameName)
    {
#ifdef IDYNTREE_USES_IPOPT
        iDynTree::LinkIndex frameIndex = IK_PIMPL(m_pimpl)->m_dynamics.getFrameIndex(frameName);
        if (frameIndex < 0)
        {
            return false;
        }

        internal::kinematics::TransformMap::iterator it = IK_PIMPL(m_pimpl)->m_constraints.find(frameIndex);
        if (it == IK_PIMPL(m_pimpl)->m_constraints.end())
        {
            return false;
        }

        it->second.setActive(false);

        // The problem needs to be reinitialized
        IK_PIMPL(m_pimpl)->m_problemInitialized = false;

        return true;
#else
        return missingIpoptErrorReport();
#endif
    }